

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  ReusableStringStream rss;
  ReusableStringStream local_50;
  string local_40 [32];
  
  if (((this->reconstructedExpression)._M_string_length == 0) &&
     ((this->lazyExpression).m_transientExpression != (ITransientExpression *)0x0)) {
    ReusableStringStream::ReusableStringStream(&local_50);
    Catch::operator<<(local_50.m_oss,&this->lazyExpression);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->reconstructedExpression,local_40);
    std::__cxx11::string::~string(local_40);
    ReusableStringStream::~ReusableStringStream(&local_50);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->reconstructedExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }